

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SentencePieceLearner.cc
# Opt level: O1

void __thiscall
onmt::SentencePieceLearner::learn
          (SentencePieceLearner *this,string *model_path,char *param_2,bool verbose)

{
  basic_ofstream<char,_std::char_traits<char>_> *pbVar1;
  pointer pcVar2;
  long *plVar3;
  runtime_error *this_00;
  size_type *psVar4;
  long *plVar5;
  SentenceIterator *pSVar6;
  byte bVar7;
  string_view args;
  string sp_model_path;
  Status status;
  string sp_vocab_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  SentenceIterator *local_b8;
  char *local_b0;
  SentenceIterator local_a8;
  long lStack_a0;
  Status local_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar7 = verbose | (this->super_SubwordLearner)._verbose;
  if ((this->_input_stream)._M_t.
      super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl != (basic_ofstream<char,_std::char_traits<char>_> *)0x0) {
    std::ostream::flush();
    pbVar1 = (this->_input_stream)._M_t.
             super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl;
    (this->_input_stream)._M_t.
    super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>._M_head_impl
         = (basic_ofstream<char,_std::char_traits<char>_> *)0x0;
    if (pbVar1 != (basic_ofstream<char,_std::char_traits<char>_> *)0x0) {
      (**(code **)(*(long *)pbVar1 + 8))();
    }
  }
  if ((bVar7 & 1) == 0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x38a738);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar2 = (this->_args)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (this->_args)._M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)(this->_input_filename)._M_dataplus._M_p);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_50.field_2._M_allocated_capacity = *psVar4;
    local_50.field_2._8_8_ = plVar3[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar4;
    local_50._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_50._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_80 = *plVar5;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(model_path->_M_dataplus)._M_p);
  pSVar6 = (SentenceIterator *)(plVar3 + 2);
  if ((SentenceIterator *)*plVar3 == pSVar6) {
    local_a8._vptr_SentenceIterator = pSVar6->_vptr_SentenceIterator;
    lStack_a0 = plVar3[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8._vptr_SentenceIterator = pSVar6->_vptr_SentenceIterator;
    local_b8 = (SentenceIterator *)*plVar3;
  }
  local_b0 = (char *)plVar3[1];
  *plVar3 = (long)pSVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  args._M_str = local_b0;
  args._M_len = (size_t)&local_98;
  sentencepiece::SentencePieceTrainer::Train(args,local_b8,(string *)0x0);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,(long)local_a8._vptr_SentenceIterator + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((bVar7 & 1) == 0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x38a738);
  }
  if (this->_keep_input_file == false) {
    remove((this->_input_filename)._M_dataplus._M_p);
  }
  pcVar2 = (model_path->_M_dataplus)._M_p;
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar2,pcVar2 + model_path->_M_string_length);
  std::__cxx11::string::append((char *)&local_b8);
  pcVar2 = (model_path->_M_dataplus)._M_p;
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + model_path->_M_string_length);
  std::__cxx11::string::append((char *)&local_90);
  if (local_98.rep_._M_t.
      super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
      ._M_t.
      super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
      .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl ==
      (__uniq_ptr_data<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>,_true,_true>
       )0x0) {
    if (this->_keep_vocab == false) {
      rename((char *)local_b8,(model_path->_M_dataplus)._M_p);
      remove((char *)local_90);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,(long)local_a8._vptr_SentenceIterator + 1);
    }
    sentencepiece::util::Status::~Status(&local_98);
    return;
  }
  remove((char *)local_b8);
  remove((char *)local_90);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  sentencepiece::util::Status::ToString_abi_cxx11_(&local_70,&local_98);
  std::operator+(&local_50,"SentencePieceTrainer: ",&local_70);
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SentencePieceLearner::learn(const std::string& model_path, const char*, bool verbose)
  {
    verbose = verbose || _verbose;
    if (_input_stream) {
      _input_stream->flush();
      _input_stream.reset();  // Freeze the input file for training.
    }

    if (!verbose)
      std::cerr.setstate(std::ios_base::failbit);
    auto status = sentencepiece::SentencePieceTrainer::Train(_args
                                                             + " --input=" + _input_filename
                                                             + " --model_prefix=" + model_path);
    if (!verbose)
      std::cerr.clear();

    // Cleanup the input file.
    if (!_keep_input_file) { remove(_input_filename.c_str()); }

    std::string sp_model_path = model_path + ".model";
    std::string sp_vocab_path = model_path + ".vocab";

    if (!status.ok())
    {
      // Cleanup the output files on error.
      remove(sp_model_path.c_str());
      remove(sp_vocab_path.c_str());
      throw std::runtime_error("SentencePieceTrainer: " + status.ToString());
    }
    else if (!_keep_vocab)
    {
      // Remove the generated vocabulary and move the model to the request path.
      rename(sp_model_path.c_str(), model_path.c_str());
      remove(sp_vocab_path.c_str());
    }
  }